

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD5Importer::AttachChilds_Mesh
          (MD5Importer *this,int iParentID,aiNode *piParent,BoneList *bones)

{
  float fVar1;
  undefined1 auVar2 [16];
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  aiNode **ppaVar6;
  aiNode *this_00;
  reference pvVar7;
  bool bVar8;
  aiMatrix4x4t<float> local_4fc;
  aiMatrix3x3t<float> local_4bc;
  aiMatrix4x4t<float> local_498;
  undefined1 local_458 [8];
  aiQuaternion quat;
  aiNode *pc;
  int i_1;
  int i;
  BoneList *bones_local;
  aiNode *piParent_local;
  int iParentID_local;
  MD5Importer *this_local;
  
  bVar8 = false;
  if (piParent != (aiNode *)0x0) {
    bVar8 = piParent->mNumChildren == 0;
  }
  if (!bVar8) {
    __assert_fail("__null != piParent && !piParent->mNumChildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD5/MD5Loader.cpp"
                  ,0x10b,"void Assimp::MD5Importer::AttachChilds_Mesh(int, aiNode *, BoneList &)");
  }
  pc._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::size(bones);
    if ((int)sVar3 <= pc._4_4_) break;
    if (iParentID != pc._4_4_) {
      pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
               operator[](bones,(long)pc._4_4_);
      if ((pvVar4->super_BaseJointDescription).mParentIndex == iParentID) {
        piParent->mNumChildren = piParent->mNumChildren + 1;
      }
    }
    pc._4_4_ = pc._4_4_ + 1;
  }
  if (piParent->mNumChildren != 0) {
    auVar2 = ZEXT416(piParent->mNumChildren) * ZEXT816(8);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiNode **)operator_new__(uVar5);
    piParent->mChildren = ppaVar6;
    pc._0_4_ = 0;
    while( true ) {
      sVar3 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::size
                        (bones);
      if ((int)sVar3 <= (int)pc) break;
      if (iParentID != (int)pc) {
        pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                 operator[](bones,(long)(int)pc);
        if ((pvVar4->super_BaseJointDescription).mParentIndex == iParentID) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          ppaVar6 = piParent->mChildren;
          piParent->mChildren = ppaVar6 + 1;
          *ppaVar6 = this_00;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          aiString::aiString((aiString *)&quat.y,(aiString *)pvVar4);
          aiString::operator=((aiString *)this_00,(aiString *)&quat.y);
          this_00->mParent = piParent;
          aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)local_458);
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          MD5::ConvertQuaternion(&pvVar4->mRotationQuat,(aiQuaternion *)local_458);
          aiQuaterniont<float>::GetMatrix(&local_4bc,(aiQuaterniont<float> *)local_458);
          aiMatrix4x4t<float>::aiMatrix4x4t(&local_498,&local_4bc);
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          memcpy(&pvVar4->mTransform,&local_498,0x40);
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          fVar1 = (pvVar4->mPositionXYZ).x;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          (pvVar4->mTransform).a4 = fVar1;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          fVar1 = (pvVar4->mPositionXYZ).y;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          (pvVar4->mTransform).b4 = fVar1;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          fVar1 = (pvVar4->mPositionXYZ).z;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          (pvVar4->mTransform).c4 = fVar1;
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          pvVar7 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          memcpy(&pvVar7->mInvTransform,&pvVar4->mTransform,0x40);
          memcpy(&this_00->mTransformation,&pvVar7->mInvTransform,0x40);
          pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                   operator[](bones,(long)(int)pc);
          aiMatrix4x4t<float>::Inverse(&pvVar4->mInvTransform);
          if (iParentID != -1) {
            pvVar4 = std::vector<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>::
                     operator[](bones,(long)iParentID);
            aiMatrix4x4t<float>::operator*
                      (&local_4fc,&pvVar4->mInvTransform,&this_00->mTransformation);
            memcpy(&this_00->mTransformation,&local_4fc,0x40);
          }
          AttachChilds_Mesh(this,(int)pc,this_00,bones);
        }
      }
      pc._0_4_ = (int)pc + 1;
    }
    piParent->mChildren = piParent->mChildren + -(ulong)piParent->mNumChildren;
  }
  return;
}

Assistant:

void MD5Importer::AttachChilds_Mesh(int iParentID,aiNode* piParent, BoneList& bones)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)   {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the transformation matrix from rotation and translational components
                aiQuaternion quat;
                MD5::ConvertQuaternion ( bones[i].mRotationQuat, quat );

                bones[i].mTransform = aiMatrix4x4 ( quat.GetMatrix());
                bones[i].mTransform.a4 = bones[i].mPositionXYZ.x;
                bones[i].mTransform.b4 = bones[i].mPositionXYZ.y;
                bones[i].mTransform.c4 = bones[i].mPositionXYZ.z;

                // store it for later use
                pc->mTransformation = bones[i].mInvTransform = bones[i].mTransform;
                bones[i].mInvTransform.Inverse();

                // the transformations for each bone are absolute, so we need to multiply them
                // with the inverse of the absolute matrix of the parent joint
                if (-1 != iParentID)    {
                    pc->mTransformation = bones[iParentID].mInvTransform * pc->mTransformation;
                }

                // add children to this node, too
                AttachChilds_Mesh( i, pc, bones);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}